

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2
          (DataPageHeaderV2 *this,void **vtt,DataPageHeaderV2 *other70)

{
  void *pvVar1;
  int32_t iVar2;
  int32_t iVar3;
  type tVar4;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x30)) = vtt[1];
  Statistics::Statistics(&this->statistics);
  this->__isset = (_DataPageHeaderV2__isset)(((byte)this->__isset & 0xfc) + 1);
  iVar2 = other70->num_nulls;
  iVar3 = other70->num_rows;
  tVar4 = other70->encoding;
  this->num_values = other70->num_values;
  this->num_nulls = iVar2;
  this->num_rows = iVar3;
  this->encoding = tVar4;
  iVar2 = other70->repetition_levels_byte_length;
  this->definition_levels_byte_length = other70->definition_levels_byte_length;
  this->repetition_levels_byte_length = iVar2;
  this->is_compressed = other70->is_compressed;
  Statistics::operator=(&this->statistics,&other70->statistics);
  this->__isset = other70->__isset;
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2(const DataPageHeaderV2& other70) {
  num_values = other70.num_values;
  num_nulls = other70.num_nulls;
  num_rows = other70.num_rows;
  encoding = other70.encoding;
  definition_levels_byte_length = other70.definition_levels_byte_length;
  repetition_levels_byte_length = other70.repetition_levels_byte_length;
  is_compressed = other70.is_compressed;
  statistics = other70.statistics;
  __isset = other70.__isset;
}